

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetTranslucent
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  int iVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  double dVar10;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar3 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d2dd4;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          dVar1 = param[1].field_0.f;
          if (numparam < 3) {
            param = defaultparam->Array;
            if (param[2].field_0.field_3.Type == '\0') goto LAB_003d2d36;
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
LAB_003d2d36:
              iVar2 = param[2].field_0.i;
              *(byte *)((long)puVar3 + 0x10b) = *(byte *)((long)puVar3 + 0x10b) & 0xfd;
              dVar10 = 1.0;
              if (dVar1 <= 1.0) {
                dVar10 = dVar1;
              }
              puVar3[0x23] = -(ulong)(0.0 < dVar1) & (ulong)dVar10;
              uVar7 = 6;
              if (iVar2 != 0) {
                uVar7 = (ulong)((uint)(iVar2 != 2) * 5 + 2);
              }
              *(FRenderStyle *)(puVar3 + 0x21) = LegacyRenderStyles[uVar7];
              return 0;
            }
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xcb3,
                        "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar8 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcb2,
                    "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d2dd4:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xcb1,
                "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetTranslucent)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT		(alpha);
	PARAM_INT_DEF	(mode);

	mode = mode == 0 ? STYLE_Translucent : mode == 2 ? STYLE_Fuzzy : STYLE_Add;

	self->RenderStyle.Flags &= ~STYLEF_Alpha1;
	self->Alpha = clamp(alpha, 0., 1.);
	self->RenderStyle = ERenderStyle(mode);
	return 0;
}